

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satInterB.c
# Opt level: O0

int Intb_ManGetGlobalVar(Intb_Man_t *p,int Var)

{
  int iVar1;
  int VarAB;
  int Var_local;
  Intb_Man_t *p_local;
  
  if (p->pVarTypes[Var] < 0) {
    p_local._4_4_ = -1 - p->pVarTypes[Var];
    if ((p_local._4_4_ < 0) || (iVar1 = Vec_IntSize(p->vVarsAB), iVar1 <= p_local._4_4_)) {
      __assert_fail("VarAB >= 0 && VarAB < Vec_IntSize(p->vVarsAB)",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bsat/satInterB.c"
                    ,0x229,"int Intb_ManGetGlobalVar(Intb_Man_t *, int)");
    }
  }
  else {
    p_local._4_4_ = -1;
  }
  return p_local._4_4_;
}

Assistant:

int Intb_ManGetGlobalVar( Intb_Man_t * p, int Var )
{
    int VarAB;
    if ( p->pVarTypes[Var] >= 0 ) // global var
        return -1;
    VarAB = -p->pVarTypes[Var]-1;
    assert( VarAB >= 0 && VarAB < Vec_IntSize(p->vVarsAB) );
    return VarAB;
}